

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  array_container_t *src_1;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  array_container_t *array2;
  array_container_t *paVar17;
  ushort uVar18;
  ushort uVar19;
  ulong uVar20;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar10 = 0;
  if (iVar2 < 1 || iVar1 < 1) {
    return false;
  }
  puVar3 = (x1->high_low_container).keys;
  puVar4 = (x2->high_low_container).keys;
  uVar20 = 0;
  do {
    uVar14 = (uint)uVar10;
    uVar12 = uVar14 & 0xffff;
    uVar18 = puVar3[uVar12];
    uVar13 = (uint)uVar20;
    uVar15 = uVar13 & 0xffff;
    uVar19 = puVar4[uVar15];
    if (uVar18 != uVar19) {
      if (uVar18 < uVar19) {
        uVar13 = uVar14 + 1;
        if (((int)uVar13 < iVar1) && (puVar3[(int)uVar13] < uVar19)) {
          uVar14 = uVar14 + 2;
          iVar16 = 1;
          if ((int)uVar14 < iVar1) {
            iVar8 = 1;
            do {
              uVar18 = puVar3[(int)uVar14];
              uVar10 = (ulong)uVar14;
              iVar16 = iVar8;
              if (uVar19 <= uVar18) goto LAB_0011c17b;
              iVar16 = iVar8 * 2;
              uVar14 = uVar13 + iVar8 * 2;
              iVar8 = iVar16;
            } while ((int)uVar14 < iVar1);
          }
          uVar18 = puVar3[iVar1 - 1];
          uVar10 = (ulong)(iVar1 - 1);
LAB_0011c17b:
          if (uVar18 != uVar19) {
            if (uVar18 < uVar19) {
              return false;
            }
            if ((iVar16 >> 1) + uVar13 + 1 != (int)uVar10) {
              uVar13 = (iVar16 >> 1) + uVar13;
              do {
                uVar12 = (int)(uVar13 + (int)uVar10) >> 1;
                if (puVar3[(int)uVar12] == uVar19) {
                  uVar10 = (ulong)uVar12;
                  break;
                }
                if (uVar19 <= puVar3[(int)uVar12]) {
                  uVar10 = (ulong)uVar12;
                  uVar12 = uVar13;
                }
                uVar13 = uVar12;
              } while (uVar13 + 1 != (int)uVar10);
            }
          }
        }
        else {
          uVar10 = (ulong)uVar13;
        }
      }
      else {
        uVar12 = uVar13 + 1;
        if (((int)uVar12 < iVar2) && (puVar4[(int)uVar12] < uVar18)) {
          uVar13 = uVar13 + 2;
          iVar16 = 1;
          if ((int)uVar13 < iVar2) {
            iVar16 = 1;
            do {
              uVar19 = puVar4[(int)uVar13];
              uVar20 = (ulong)uVar13;
              if (uVar18 <= uVar19) goto LAB_0011c21a;
              iVar8 = iVar16 * 2;
              uVar13 = uVar12 + iVar16 * 2;
              iVar16 = iVar8;
            } while ((int)uVar13 < iVar2);
          }
          uVar19 = puVar4[iVar2 - 1];
          uVar20 = (ulong)(iVar2 - 1);
LAB_0011c21a:
          if (uVar19 != uVar18) {
            if (uVar19 < uVar18) {
              return false;
            }
            if ((iVar16 >> 1) + uVar12 + 1 != (int)uVar20) {
              uVar12 = (iVar16 >> 1) + uVar12;
              do {
                uVar13 = (int)(uVar12 + (int)uVar20) >> 1;
                if (puVar4[(int)uVar13] == uVar18) {
                  uVar20 = (ulong)uVar13;
                  break;
                }
                if (uVar18 <= puVar4[(int)uVar13]) {
                  uVar20 = (ulong)uVar13;
                  uVar13 = uVar12;
                }
                uVar12 = uVar13;
              } while (uVar12 + 1 != (int)uVar20);
            }
          }
        }
        else {
          uVar20 = (ulong)uVar12;
        }
      }
      goto LAB_0011c388;
    }
    bVar9 = (x1->high_low_container).typecodes[uVar12];
    src_1 = (array_container_t *)(x1->high_low_container).containers[uVar12];
    bVar11 = (x2->high_low_container).typecodes[uVar15];
    array2 = (array_container_t *)(x2->high_low_container).containers[uVar15];
    if (bVar9 == 4) {
      bVar9 = *(byte *)&src_1->array;
      if (bVar9 == 4) goto LAB_0011c3b8;
      src_1 = *(array_container_t **)src_1;
    }
    if (bVar11 == 4) {
      bVar11 = *(byte *)&array2->array;
      if (bVar11 == 4) {
LAB_0011c3b8:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      array2 = *(array_container_t **)array2;
    }
    switch((uint)bVar11 + (uint)bVar9 * 4) {
    case 5:
      if ((*(ulong *)src_1->array & *(ulong *)array2->array) != 0) {
        return true;
      }
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 0x3fe) goto LAB_0011c36a;
        lVar5 = uVar10 + 2;
        uVar20 = uVar10 + 1;
        lVar6 = uVar10 + 2;
        uVar10 = uVar20;
      } while ((*(ulong *)((long)src_1->array + lVar6 * 8) &
               *(ulong *)((long)array2->array + lVar5 * 8)) == 0);
      if (uVar20 < 0x3ff) {
        return true;
      }
      break;
    case 6:
      uVar10 = (ulong)array2->cardinality;
      if ((long)uVar10 < 1) goto LAB_0011c36a;
      uVar18 = *array2->array;
      if ((*(ulong *)(src_1->array + (ulong)(uVar18 >> 6) * 4) >> ((ulong)uVar18 & 0x3f) & 1) != 0)
      {
        return true;
      }
      uVar20 = 0;
      do {
        if (uVar10 - 1 == uVar20) goto LAB_0011c383;
        uVar18 = array2->array[uVar20 + 1];
        uVar20 = uVar20 + 1;
      } while ((*(ulong *)(src_1->array + (ulong)(uVar18 >> 6) * 4) >> ((ulong)uVar18 & 0x3f) & 1)
               == 0);
LAB_0011c363:
      if (uVar20 < uVar10) {
        return true;
      }
      break;
    case 7:
      paVar17 = src_1;
      goto LAB_0011c374;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x139e,
                    "_Bool container_intersect(const container_t *, uint8_t, const container_t *, uint8_t)"
                   );
    case 9:
      uVar10 = (ulong)src_1->cardinality;
      if (0 < (long)uVar10) {
        uVar18 = *src_1->array;
        if ((*(ulong *)(array2->array + (ulong)(uVar18 >> 6) * 4) >> ((ulong)uVar18 & 0x3f) & 1) !=
            0) {
          return true;
        }
        uVar20 = 0;
        do {
          if (uVar10 - 1 == uVar20) goto LAB_0011c383;
          uVar18 = src_1->array[uVar20 + 1];
          uVar20 = uVar20 + 1;
        } while ((*(ulong *)(array2->array + (ulong)(uVar18 >> 6) * 4) >> ((ulong)uVar18 & 0x3f) & 1
                 ) == 0);
        goto LAB_0011c363;
      }
LAB_0011c36a:
      uVar10 = (ulong)(uVar14 + 1);
      uVar20 = (ulong)(uVar13 + 1);
      goto LAB_0011c388;
    case 10:
      _Var7 = array_container_intersect(src_1,array2);
      if (_Var7) {
        return true;
      }
      uVar10 = (ulong)(uVar14 + 1);
      uVar20 = (ulong)(uVar13 + 1);
      goto LAB_0011c388;
    case 0xb:
      paVar17 = array2;
      goto LAB_0011c2b7;
    case 0xd:
      paVar17 = array2;
      array2 = src_1;
LAB_0011c374:
      _Var7 = run_bitset_container_intersect
                        ((run_container_t *)array2,(bitset_container_t *)paVar17);
LAB_0011c379:
      if (_Var7 != false) {
        return true;
      }
      break;
    case 0xe:
      paVar17 = src_1;
      src_1 = array2;
LAB_0011c2b7:
      _Var7 = array_run_container_intersect(src_1,(run_container_t *)paVar17);
      goto LAB_0011c379;
    case 0xf:
      _Var7 = run_container_intersect((run_container_t *)src_1,(run_container_t *)array2);
      goto LAB_0011c379;
    }
LAB_0011c383:
    uVar20 = (ulong)(uVar13 + 1);
    uVar10 = (ulong)(uVar14 + 1);
LAB_0011c388:
    if (iVar1 <= (int)uVar10) {
      return false;
    }
    if (iVar2 <= (int)uVar20) {
      return false;
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(& x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(& x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            if (container_intersect(c1, type1, c2, type2))
                return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(& x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(& x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}